

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O0

void vkt::geometry::anon_unknown_0::initPrograms
               (SourceCollections *programCollection,TestParams_conflict params)

{
  char *pcVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  size_type __n;
  Vec4 *v;
  bool bVar4;
  bool bVar5;
  int local_8b4;
  int local_8b0;
  deUint32 local_8ac;
  bool local_851;
  string local_850;
  ShaderSource local_830;
  allocator<char> local_801;
  string local_800;
  ostringstream local_7e0 [8];
  ostringstream src_2;
  string local_668;
  ShaderSource local_648;
  allocator<char> local_619;
  string local_618;
  string local_5f8 [32];
  string local_5d8 [36];
  deUint32 local_5b4;
  deUint32 targetLayer;
  string local_5a0;
  byte local_57a;
  allocator<char> local_579;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  int local_558;
  allocator<char> local_551;
  int i;
  undefined1 local_530 [8];
  string padding;
  ostringstream local_508 [4];
  int numColors;
  ostringstream colorTable;
  ostringstream local_390 [8];
  ostringstream src_1;
  int maxVertices;
  int numLayers;
  ShaderSource local_1f0;
  allocator<char> local_1c1;
  string local_1c0;
  ostringstream local_190 [8];
  ostringstream src;
  bool geomOutputColor;
  SourceCollections *programCollection_local;
  
  bVar4 = params.testType == TEST_TYPE_ALL_LAYERS;
  bVar5 = params.testType == TEST_TYPE_INVOCATION_PER_LAYER;
  local_851 = bVar4 || bVar5;
  std::__cxx11::ostringstream::ostringstream(local_190);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_190,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  poVar2 = std::operator<<(poVar2,"{\n");
  std::operator<<(poVar2,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"vert",&local_1c1);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_1c0);
  std::__cxx11::ostringstream::str();
  glu::VertexSource::VertexSource((VertexSource *)&local_1f0,(string *)&maxVertices);
  glu::ProgramSources::operator<<(pPVar3,&local_1f0);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1f0);
  std::__cxx11::string::~string((string *)&maxVertices);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  if (params.image.viewType == VK_IMAGE_VIEW_TYPE_3D) {
    local_8ac = params.image.size.depth;
  }
  else {
    local_8ac = params.image.numLayers;
  }
  if (params.testType == TEST_TYPE_DIFFERENT_CONTENT) {
    local_8b0 = (local_8ac + 1) * local_8ac;
  }
  else {
    if ((params.testType == TEST_TYPE_ALL_LAYERS) || (params.testType == TEST_TYPE_LAYER_ID)) {
      local_8b4 = local_8ac << 2;
    }
    else {
      local_8b4 = 4;
      if (params.testType == TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION) {
        local_8b4 = 6;
      }
    }
    local_8b0 = local_8b4;
  }
  std::__cxx11::ostringstream::ostringstream(local_390);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_390,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  std::operator<<(poVar2,"\n");
  if ((params.testType == TEST_TYPE_INVOCATION_PER_LAYER) ||
     (params.testType == TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION)) {
    poVar2 = std::operator<<((ostream *)local_390,"layout(points, invocations = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8ac);
    std::operator<<(poVar2,") in;\n");
  }
  else {
    std::operator<<((ostream *)local_390,"layout(points) in;\n");
  }
  poVar2 = std::operator<<((ostream *)local_390,"layout(triangle_strip, max_vertices = ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8b0);
  poVar2 = std::operator<<(poVar2,") out;\n");
  poVar2 = std::operator<<(poVar2,"\n");
  pcVar1 = "";
  if (local_851) {
    pcVar1 = "layout(location = 0) out vec4 vert_color;\n\n";
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,"out gl_PerVertex {\n");
  poVar2 = std::operator<<(poVar2,"    vec4 gl_Position;\n");
  poVar2 = std::operator<<(poVar2,"};\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  std::operator<<(poVar2,"{\n");
  std::__cxx11::ostringstream::ostringstream(local_508);
  padding.field_2._12_4_ = 6;
  poVar2 = std::operator<<((ostream *)local_508,"    const vec4 colors[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,6);
  poVar2 = std::operator<<(poVar2,"] = vec4[");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,6);
  std::operator<<(poVar2,"](");
  std::__cxx11::ostringstream::str();
  __n = std::__cxx11::string::length();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_530,__n,' ',&local_551);
  std::allocator<char>::~allocator(&local_551);
  std::__cxx11::string::~string((string *)&i);
  for (local_558 = 0; local_558 < 6; local_558 = local_558 + 1) {
    local_57a = 0;
    if (local_558 == 0) {
      std::allocator<char>::allocator();
      local_57a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_578,"",&local_579);
    }
    else {
      std::operator+(&local_578,",\n",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_530)
      ;
    }
    poVar2 = std::operator<<((ostream *)local_508,(string *)&local_578);
    tcu::Vector<float,_4>::Vector
              ((Vector<float,_4> *)&stack0xfffffffffffffa50,
               (float (*) [4])(geometry::(anonymous_namespace)::s_colors + (long)local_558 * 0x10));
    geometry::(anonymous_namespace)::toGlsl_abi_cxx11_
              (&local_5a0,(_anonymous_namespace_ *)&stack0xfffffffffffffa50,v);
    std::operator<<(poVar2,(string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_5a0);
    std::__cxx11::string::~string((string *)&local_578);
    if ((local_57a & 1) != 0) {
      std::allocator<char>::~allocator(&local_579);
    }
  }
  std::operator<<((ostream *)local_508,");\n");
  std::__cxx11::string::~string((string *)local_530);
  if (params.testType == TEST_TYPE_DEFAULT_LAYER) {
    poVar2 = std::operator<<((ostream *)local_390,"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n")
    ;
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n");
    std::operator<<(poVar2,"    EmitVertex();\n");
  }
  else if (params.testType == TEST_TYPE_SINGLE_LAYER) {
    local_5b4 = getTargetLayer(&params.image);
    poVar2 = std::operator<<((ostream *)local_390,"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n")
    ;
    poVar2 = std::operator<<(poVar2,"    gl_Layer    = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5b4);
    poVar2 = std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    gl_Layer    = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5b4);
    poVar2 = std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    gl_Layer    = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5b4);
    poVar2 = std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    gl_Layer    = ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5b4);
    poVar2 = std::operator<<(poVar2,";\n");
    std::operator<<(poVar2,"    EmitVertex();\n");
  }
  else if (params.testType == TEST_TYPE_ALL_LAYERS) {
    std::__cxx11::ostringstream::str();
    poVar2 = std::operator<<((ostream *)local_390,local_5d8);
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    for (int layerNdx = 0; layerNdx < ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8ac);
    poVar2 = std::operator<<(poVar2,"; ++layerNdx) {\n");
    poVar2 = std::operator<<(poVar2,"        const int colorNdx = layerNdx % ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,6);
    poVar2 = std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"        gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"        gl_Layer    = layerNdx;\n");
    poVar2 = std::operator<<(poVar2,"        vert_color  = colors[colorNdx];\n");
    poVar2 = std::operator<<(poVar2,"        EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"        gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"        gl_Layer    = layerNdx;\n");
    poVar2 = std::operator<<(poVar2,"        vert_color  = colors[colorNdx];\n");
    poVar2 = std::operator<<(poVar2,"        EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"        gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"        gl_Layer    = layerNdx;\n");
    poVar2 = std::operator<<(poVar2,"        vert_color  = colors[colorNdx];\n");
    poVar2 = std::operator<<(poVar2,"        EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"        gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"        gl_Layer    = layerNdx;\n");
    poVar2 = std::operator<<(poVar2,"        vert_color  = colors[colorNdx];\n");
    poVar2 = std::operator<<(poVar2,"        EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"        EndPrimitive();\n");
    std::operator<<(poVar2,"    };\n");
    std::__cxx11::string::~string(local_5d8);
  }
  else if (params.testType == TEST_TYPE_LAYER_ID) {
    poVar2 = std::operator<<((ostream *)local_390,"    for (int layerNdx = 0; layerNdx < ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8ac);
    poVar2 = std::operator<<(poVar2,"; ++layerNdx) {\n");
    poVar2 = std::operator<<(poVar2,"        gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"        gl_Layer    = layerNdx;\n");
    poVar2 = std::operator<<(poVar2,"        EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"        gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"        gl_Layer    = layerNdx;\n");
    poVar2 = std::operator<<(poVar2,"        EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"        gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"        gl_Layer    = layerNdx;\n");
    poVar2 = std::operator<<(poVar2,"        EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"        gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"        gl_Layer    = layerNdx;\n");
    poVar2 = std::operator<<(poVar2,"        EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"        EndPrimitive();\n");
    std::operator<<(poVar2,"    };\n");
  }
  else if (params.testType == TEST_TYPE_DIFFERENT_CONTENT) {
    poVar2 = std::operator<<((ostream *)local_390,"    for (int layerNdx = 0; layerNdx < ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8ac);
    poVar2 = std::operator<<(poVar2,"; ++layerNdx) {\n");
    poVar2 = std::operator<<(poVar2,"        for (int colNdx = 0; colNdx <= layerNdx; ++colNdx) {\n"
                            );
    poVar2 = std::operator<<(poVar2,"            const float posX = float(colNdx) / float(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8ac);
    poVar2 = std::operator<<(poVar2,") * 2.0 - 1.0;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"            gl_Position = vec4(posX,  1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"            gl_Layer    = layerNdx;\n");
    poVar2 = std::operator<<(poVar2,"            EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"            gl_Position = vec4(posX, -1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"            gl_Layer    = layerNdx;\n");
    poVar2 = std::operator<<(poVar2,"            EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"        }\n");
    poVar2 = std::operator<<(poVar2,"        EndPrimitive();\n");
    std::operator<<(poVar2,"    }\n");
  }
  else if (params.testType == TEST_TYPE_INVOCATION_PER_LAYER) {
    std::__cxx11::ostringstream::str();
    poVar2 = std::operator<<((ostream *)local_390,local_5f8);
    poVar2 = std::operator<<(poVar2,"    const int colorNdx = gl_InvocationID % ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,6);
    poVar2 = std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    gl_Layer    = gl_InvocationID;\n");
    poVar2 = std::operator<<(poVar2,"    vert_color  = colors[colorNdx];\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    gl_Layer    = gl_InvocationID;\n");
    poVar2 = std::operator<<(poVar2,"    vert_color  = colors[colorNdx];\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    gl_Layer    = gl_InvocationID;\n");
    poVar2 = std::operator<<(poVar2,"    vert_color  = colors[colorNdx];\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    gl_Layer    = gl_InvocationID;\n");
    poVar2 = std::operator<<(poVar2,"    vert_color  = colors[colorNdx];\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    std::operator<<(poVar2,"    EndPrimitive();\n");
    std::__cxx11::string::~string(local_5f8);
  }
  else if (params.testType == TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION) {
    poVar2 = std::operator<<((ostream *)local_390,"    const int   layerA = gl_InvocationID;\n");
    poVar2 = std::operator<<(poVar2,"    const int   layerB = (gl_InvocationID + 1) % ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8ac);
    poVar2 = std::operator<<(poVar2,";\n");
    poVar2 = std::operator<<(poVar2,"    const float aEnd   = float(layerA) / float(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8ac);
    poVar2 = std::operator<<(poVar2,") * 2.0 - 1.0;\n");
    poVar2 = std::operator<<(poVar2,"    const float bEnd   = float(layerB) / float(");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_8ac);
    poVar2 = std::operator<<(poVar2,") * 2.0 - 1.0;\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    gl_Layer    = layerA;\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    gl_Layer    = layerA;\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4(aEnd, -1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    gl_Layer    = layerA;\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"    EndPrimitive();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    gl_Layer    = layerB;\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4(bEnd,  1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    gl_Layer    = layerB;\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    poVar2 = std::operator<<(poVar2,"\n");
    poVar2 = std::operator<<(poVar2,"    gl_Position = vec4(bEnd, -1.0, 0.0, 1.0);\n");
    poVar2 = std::operator<<(poVar2,"    gl_Layer    = layerB;\n");
    poVar2 = std::operator<<(poVar2,"    EmitVertex();\n");
    std::operator<<(poVar2,"    EndPrimitive();\n");
  }
  std::operator<<((ostream *)local_390,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_618,"geom",&local_619);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_618);
  std::__cxx11::ostringstream::str();
  glu::GeometrySource::GeometrySource((GeometrySource *)&local_648,&local_668);
  glu::ProgramSources::operator<<(pPVar3,&local_648);
  glu::GeometrySource::~GeometrySource((GeometrySource *)&local_648);
  std::__cxx11::string::~string((string *)&local_668);
  std::__cxx11::string::~string((string *)&local_618);
  std::allocator<char>::~allocator(&local_619);
  std::__cxx11::ostringstream::~ostringstream(local_508);
  std::__cxx11::ostringstream::~ostringstream(local_390);
  std::__cxx11::ostringstream::ostringstream(local_7e0);
  pcVar1 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar2 = std::operator<<((ostream *)local_7e0,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"layout(location = 0) out vec4 o_color;\n");
  pcVar1 = "";
  if (local_851) {
    pcVar1 = "layout(location = 0) in  vec4 vert_color;\n";
  }
  poVar2 = std::operator<<(poVar2,pcVar1);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"void main(void)\n");
  std::operator<<(poVar2,"{\n");
  if (params.testType == TEST_TYPE_LAYER_ID) {
    poVar2 = std::operator<<((ostream *)local_7e0,
                             "    o_color = vec4( (gl_Layer    % 2) == 1 ? 1.0 : 0.5,\n");
    poVar2 = std::operator<<(poVar2,"                   ((gl_Layer/2) % 2) == 1 ? 1.0 : 0.5,\n");
    poVar2 = std::operator<<(poVar2,"                     gl_Layer         == 0 ? 1.0 : 0.0,\n");
    std::operator<<(poVar2,"                                             1.0);\n");
  }
  else if (bVar4 || bVar5) {
    std::operator<<((ostream *)local_7e0,"    o_color = vert_color;\n");
  }
  else {
    std::operator<<((ostream *)local_7e0,"    o_color = vec4(1.0);\n");
  }
  std::operator<<((ostream *)local_7e0,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_800,"frag",&local_801);
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&programCollection->glslSources,&local_800);
  std::__cxx11::ostringstream::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_830,&local_850);
  glu::ProgramSources::operator<<(pPVar3,&local_830);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_830);
  std::__cxx11::string::~string((string *)&local_850);
  std::__cxx11::string::~string((string *)&local_800);
  std::allocator<char>::~allocator(&local_801);
  std::__cxx11::ostringstream::~ostringstream(local_7e0);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const TestParams params)
{
	const bool geomOutputColor = (params.testType == TEST_TYPE_ALL_LAYERS || params.testType == TEST_TYPE_INVOCATION_PER_LAYER);

	// Vertex shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "}\n";

		programCollection.glslSources.add("vert") << glu::VertexSource(src.str());
	}

	// Geometry shader
	{
		const int numLayers		= static_cast<int>(params.image.viewType == VK_IMAGE_VIEW_TYPE_3D ? params.image.size.depth : params.image.numLayers);

		const int maxVertices	= (params.testType == TEST_TYPE_DIFFERENT_CONTENT)										? (numLayers + 1) * numLayers :
								  (params.testType == TEST_TYPE_ALL_LAYERS || params.testType == TEST_TYPE_LAYER_ID)	? numLayers * 4 :
								  (params.testType == TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION)							? 6 : 4;

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n";

		if (params.testType == TEST_TYPE_INVOCATION_PER_LAYER || params.testType == TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION)
			src << "layout(points, invocations = " << numLayers << ") in;\n";
		else
			src << "layout(points) in;\n";

		src << "layout(triangle_strip, max_vertices = " << maxVertices << ") out;\n"
			<< "\n"
			<< (geomOutputColor ? "layout(location = 0) out vec4 vert_color;\n\n" : "")
			<< "out gl_PerVertex {\n"
			<< "    vec4 gl_Position;\n"
			<< "};\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n";

		std::ostringstream colorTable;
		{
			const int numColors = DE_LENGTH_OF_ARRAY(s_colors);

			colorTable << "    const vec4 colors[" << numColors << "] = vec4[" << numColors << "](";

			const std::string padding(colorTable.str().length(), ' ');

			for (int i = 0; i < numColors; ++i)
				colorTable << (i != 0 ? ",\n" + padding : "") << toGlsl(s_colors[i]);

			colorTable << ");\n";
		}

		if (params.testType == TEST_TYPE_DEFAULT_LAYER)
		{
			src << "    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n"
				<< "    EmitVertex();\n";
		}
		else if (params.testType == TEST_TYPE_SINGLE_LAYER)
		{
			const deUint32 targetLayer = getTargetLayer(params.image);

			src << "    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = " << targetLayer << ";\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = " << targetLayer << ";\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = " << targetLayer << ";\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = " << targetLayer << ";\n"
				<< "    EmitVertex();\n";
		}
		else if (params.testType == TEST_TYPE_ALL_LAYERS)
		{
			src << colorTable.str()
				<< "\n"
				<< "    for (int layerNdx = 0; layerNdx < " << numLayers << "; ++layerNdx) {\n"
				<< "        const int colorNdx = layerNdx % " << DE_LENGTH_OF_ARRAY(s_colors) << ";\n"
				<< "\n"
				<< "        gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        vert_color  = colors[colorNdx];\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        vert_color  = colors[colorNdx];\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        vert_color  = colors[colorNdx];\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        vert_color  = colors[colorNdx];\n"
				<< "        EmitVertex();\n"
				<< "        EndPrimitive();\n"
				<< "    };\n";
		}
		else if (params.testType == TEST_TYPE_LAYER_ID)
		{
			src << "    for (int layerNdx = 0; layerNdx < " << numLayers << "; ++layerNdx) {\n"
				<< "        gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        EmitVertex();\n"
				<< "\n"
				<< "        gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n"
				<< "        gl_Layer    = layerNdx;\n"
				<< "        EmitVertex();\n"
				<< "        EndPrimitive();\n"
				<< "    };\n";
		}
		else if (params.testType == TEST_TYPE_DIFFERENT_CONTENT)
		{
			src << "    for (int layerNdx = 0; layerNdx < " << numLayers << "; ++layerNdx) {\n"
				<< "        for (int colNdx = 0; colNdx <= layerNdx; ++colNdx) {\n"
				<< "            const float posX = float(colNdx) / float(" << numLayers << ") * 2.0 - 1.0;\n"
				<< "\n"
				<< "            gl_Position = vec4(posX,  1.0, 0.0, 1.0);\n"
				<< "            gl_Layer    = layerNdx;\n"
				<< "            EmitVertex();\n"
				<< "\n"
				<< "            gl_Position = vec4(posX, -1.0, 0.0, 1.0);\n"
				<< "            gl_Layer    = layerNdx;\n"
				<< "            EmitVertex();\n"
				<< "        }\n"
				<< "        EndPrimitive();\n"
				<< "    }\n";
		}
		else if (params.testType == TEST_TYPE_INVOCATION_PER_LAYER)
		{
			src << colorTable.str()
				<< "    const int colorNdx = gl_InvocationID % " << DE_LENGTH_OF_ARRAY(s_colors) << ";\n"
				<< "\n"
				<< "    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = gl_InvocationID;\n"
				<< "    vert_color  = colors[colorNdx];\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = gl_InvocationID;\n"
				<< "    vert_color  = colors[colorNdx];\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4( 0.0, -1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = gl_InvocationID;\n"
				<< "    vert_color  = colors[colorNdx];\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4( 0.0,  1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = gl_InvocationID;\n"
				<< "    vert_color  = colors[colorNdx];\n"
				<< "    EmitVertex();\n"
				<< "    EndPrimitive();\n";
		}
		else if (params.testType == TEST_TYPE_MULTIPLE_LAYERS_PER_INVOCATION)
		{
			src << "    const int   layerA = gl_InvocationID;\n"
				<< "    const int   layerB = (gl_InvocationID + 1) % " << numLayers << ";\n"
				<< "    const float aEnd   = float(layerA) / float(" << numLayers << ") * 2.0 - 1.0;\n"
				<< "    const float bEnd   = float(layerB) / float(" << numLayers << ") * 2.0 - 1.0;\n"
				<< "\n"
				<< "    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = layerA;\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = layerA;\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4(aEnd, -1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = layerA;\n"
				<< "    EmitVertex();\n"
				<< "    EndPrimitive();\n"
				<< "\n"
				<< "    gl_Position = vec4(-1.0,  1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = layerB;\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4(bEnd,  1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = layerB;\n"
				<< "    EmitVertex();\n"
				<< "\n"
				<< "    gl_Position = vec4(bEnd, -1.0, 0.0, 1.0);\n"
				<< "    gl_Layer    = layerB;\n"
				<< "    EmitVertex();\n"
				<< "    EndPrimitive();\n";
		}
		else
			DE_ASSERT(0);

		src <<	"}\n";	// end main

		programCollection.glslSources.add("geom") << glu::GeometrySource(src.str());
	}

	// Fragment shader
	{
		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "\n"
			<< "layout(location = 0) out vec4 o_color;\n"
			<< (geomOutputColor ? "layout(location = 0) in  vec4 vert_color;\n" : "")
			<< "\n"
			<< "void main(void)\n"
			<< "{\n";

		if (params.testType == TEST_TYPE_LAYER_ID)
		{
			// This code must be in sync with verifyLayerContent()
			src << "    o_color = vec4( (gl_Layer    % 2) == 1 ? 1.0 : 0.5,\n"
				<< "                   ((gl_Layer/2) % 2) == 1 ? 1.0 : 0.5,\n"
				<< "                     gl_Layer         == 0 ? 1.0 : 0.0,\n"
				<< "                                             1.0);\n";
		}
		else if (geomOutputColor)
			src << "    o_color = vert_color;\n";
		else
			src << "    o_color = vec4(1.0);\n";

		src << "}\n";

		programCollection.glslSources.add("frag") << glu::FragmentSource(src.str());
	}
}